

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_del.c
# Opt level: O0

int mpt_path_invalidate(mpt_path *path)

{
  char *pcVar1;
  uint uVar2;
  ulong len_00;
  _mpt_vptr_buffer *p_Var3;
  int flags;
  char *base;
  size_t len;
  size_t used;
  mpt_array arr;
  mpt_path *path_local;
  
  len_00 = path->off + path->len;
  pcVar1 = path->base;
  if (pcVar1 == (char *)0x0) {
    path_local._4_4_ = 0;
    if (len_00 != 0) {
      path_local._4_4_ = -2;
    }
  }
  else if ((path->flags & 0x40) == 0) {
    path_local._4_4_ = 0;
  }
  else {
    used = (size_t)(pcVar1 + -0x20);
    if (*(ulong *)(pcVar1 + -8) < len_00) {
      path_local._4_4_ = -2;
    }
    else if (len_00 == *(ulong *)(pcVar1 + -8)) {
      path->flags = path->flags & 0xfe;
      path_local._4_4_ = 0;
    }
    else {
      arr._buf = (mpt_buffer *)path;
      uVar2 = (*(code *)**(undefined8 **)used)(used);
      if (((uVar2 & 0x100) == 0) && ((uVar2 & 1) == 0)) {
        *(byte *)((long)&(arr._buf)->_used + 1) = *(byte *)((long)&(arr._buf)->_used + 1) & 0xfe;
        *(ulong *)(used + 0x18) = len_00;
        *(undefined1 *)((long)&(arr._buf)->_vptr->get_flags + len_00) = 0;
        path_local._4_4_ = 1;
      }
      else {
        p_Var3 = (_mpt_vptr_buffer *)mpt_array_slice((mpt_array *)&used,0,len_00);
        if (p_Var3 == (_mpt_vptr_buffer *)0x0) {
          path_local._4_4_ = -1;
        }
        else {
          if (len_00 < *(ulong *)(used + 0x10)) {
            *(undefined1 *)((long)&p_Var3->get_flags + len_00) = 0;
          }
          *(ulong *)(used + 0x18) = len_00;
          (arr._buf)->_vptr = p_Var3;
          *(byte *)((long)&(arr._buf)->_used + 1) = *(byte *)((long)&(arr._buf)->_used + 1) & 0xfe;
          path_local._4_4_ = 2;
        }
      }
    }
  }
  return path_local._4_4_;
}

Assistant:

extern int mpt_path_invalidate(MPT_STRUCT(path) *path)
{
	MPT_STRUCT(array) arr;
	size_t used, len = path->off + path->len;
	char *base;
	int flags;
	
	if (!(arr._buf = (void *) path->base)) {
		return len ? -2 : 0;
	}
	if (!(path->flags & MPT_PATHFLAG(HasArray))) {
		return 0;
	}
	used = (--arr._buf)->_used;
	
	if (len > used) {
		return MPT_ERROR(BadValue);
	}
	if (len == used) {
		path->flags &= ~MPT_PATHFLAG(KeepPost);
		return 0;
	}
	/* can modify local copy */
	flags = arr._buf->_vptr->get_flags(arr._buf);
	if (!(MPT_ENUM(BufferShared) & flags)
	 && !(MPT_ENUM(BufferImmutable) & flags)) {
		path->flags &= ~MPT_PATHFLAG(KeepPost);
		arr._buf->_used = len;
		((char *) path->base)[len] = 0;
		return 1;
	}
	/* create local buffer copy */
	if (!(base = mpt_array_slice(&arr, 0, len))) {
		return -1;
	}
	if (arr._buf->_size > len) {
		base[len] = '\0';
	}
	arr._buf->_used = len;
	path->base = base;
	path->flags &= ~MPT_PATHFLAG(KeepPost);
	return 2;
}